

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::detail::_MemoryResourceSingleChunk::release(_MemoryResourceSingleChunk *this)

{
  void *in_RDI;
  MemoryResource *unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  if ((*(long *)((long)in_RDI + 0x18) != 0) && ((*(byte *)((long)in_RDI + 0x30) & 1) != 0)) {
    MemoryResource::deallocate(unaff_retaddr,in_RDI,(size_t)in_RDI,in_stack_ffffffffffffffe8);
  }
  *(undefined8 *)((long)in_RDI + 0x18) = 0;
  *(undefined8 *)((long)in_RDI + 0x20) = 0;
  *(undefined1 *)((long)in_RDI + 0x30) = 0;
  *(undefined8 *)((long)in_RDI + 0x28) = 0;
  return;
}

Assistant:

void detail::_MemoryResourceSingleChunk::release()
{
    if(m_mem && m_owner)
    {
        impl_type::deallocate(m_mem, m_size);
    }
    m_mem = nullptr;
    m_size = 0;
    m_owner = false;
    m_pos = 0;
}